

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * dotFilter(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  char *pcVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  pcVar2 = (name->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar2;
    if ((cVar1 == '<') || (cVar1 == '>')) {
      std::operator<<(local_198,"\\");
      cVar1 = *pcVar2;
    }
    else if (cVar1 == '\0') {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(asStack_1a8);
      return __return_storage_ptr__;
    }
    std::operator<<(local_198,cVar1);
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

static
std::string dotFilter(const std::string& name) {
	std::stringstream ss;

	const char* str = name.c_str();
	while (*str) {
		if (*str == '<' || *str == '>')
			ss << "\\";

		ss << *str;
		str++;
	}

	return ss.str();
}